

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strerr_die.c
# Opt level: O0

void strerr_warn(char *x1,char *x2,char *x3,char *x4,char *x5,char *x6,strerr *se)

{
  char *x6_local;
  char *x5_local;
  char *x4_local;
  char *x3_local;
  char *x2_local;
  char *x1_local;
  
  strerr_sysinit();
  if (x1 != (char *)0x0) {
    buffer_puts(buffer_2,x1);
  }
  if (x2 != (char *)0x0) {
    buffer_puts(buffer_2,x2);
  }
  if (x3 != (char *)0x0) {
    buffer_puts(buffer_2,x3);
  }
  if (x4 != (char *)0x0) {
    buffer_puts(buffer_2,x4);
  }
  if (x5 != (char *)0x0) {
    buffer_puts(buffer_2,x5);
  }
  if (x6 != (char *)0x0) {
    buffer_puts(buffer_2,x6);
  }
  for (; se != (strerr *)0x0; se = se->who) {
    if (se->x != (char *)0x0) {
      buffer_puts(buffer_2,se->x);
    }
    if (se->y != (char *)0x0) {
      buffer_puts(buffer_2,se->y);
    }
    if (se->z != (char *)0x0) {
      buffer_puts(buffer_2,se->z);
    }
  }
  buffer_puts(buffer_2,"\n");
  buffer_flush(buffer_2);
  return;
}

Assistant:

void strerr_warn(const char *x1,const char *x2,const char *x3,const char *x4,const char *x5,const char *x6,const struct strerr *se)
{
  strerr_sysinit();
 
  if (x1) buffer_puts(buffer_2,x1);
  if (x2) buffer_puts(buffer_2,x2);
  if (x3) buffer_puts(buffer_2,x3);
  if (x4) buffer_puts(buffer_2,x4);
  if (x5) buffer_puts(buffer_2,x5);
  if (x6) buffer_puts(buffer_2,x6);
 
  while(se) {
    if (se->x) buffer_puts(buffer_2,se->x);
    if (se->y) buffer_puts(buffer_2,se->y);
    if (se->z) buffer_puts(buffer_2,se->z);
    se = se->who;
  }
 
  buffer_puts(buffer_2,"\n");
  buffer_flush(buffer_2);
}